

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O2

cayley_t * opengv::math::rot2cayley(cayley_t *__return_storage_ptr__,rotation_t *R)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix3d C;
  Matrix3d C2;
  Matrix3d C1;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_108;
  Matrix<double,_3,_3,_0,_3,_3> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_b0 [4];
  Matrix<double,_3,_3,_0,_3,_3> local_68;
  
  local_b0[0].m_lhs = R;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            (&local_68,local_b0);
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)R;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_b0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_f8);
  local_108.m_lhs = &local_68;
  local_108.m_rhs.m_xpr = (XprTypeNested)local_b0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            (&local_f8,&local_108);
  auVar2._0_8_ = -local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[7];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar3._0_8_ = -local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3];
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar3);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

opengv::cayley_t
opengv::math::rot2cayley( const rotation_t & R )
{
  Eigen::Matrix3d C1;
  Eigen::Matrix3d C2;
  Eigen::Matrix3d C;
  C1 = R-Eigen::Matrix3d::Identity();
  C2 = R+Eigen::Matrix3d::Identity();
  C = C1 * C2.inverse();

  cayley_t cayley;
  cayley[0] = -C(1,2);
  cayley[1] = C(0,2);
  cayley[2] = -C(0,1);

  return cayley;
}